

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

logical pnga_destroy(Integer g_a)

{
  int iVar1;
  cache_struct_t *pcVar2;
  global_array_t *pgVar3;
  int iVar4;
  global_array_t *pgVar5;
  long grp_id;
  long lVar6;
  void *__ptr;
  char *pcVar7;
  cache_struct *pcVar8;
  logical lVar9;
  long lVar10;
  bool bVar11;
  
  iVar4 = _ga_sync_end;
  bVar11 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  iVar1 = GA[g_a + 1000].p_handle;
  grp_id = (long)iVar1;
  if (bVar11) {
    pnga_pgroup_sync(grp_id);
  }
  lVar6 = GAme;
  if (0 < iVar1) {
    lVar6 = (long)PGRP_LIST[grp_id].map_proc_list[GAme];
  }
  GAstat.numdes = GAstat.numdes + 1;
  lVar9 = 0;
  if ((-0x3e9 < g_a) && (lVar10 = g_a + 1000, lVar10 < _max_global_array)) {
    if (GA[lVar10].actv == 0) {
      lVar9 = 0;
    }
    else {
      if (GA[lVar10].cache != (double *)0x0) {
        free(GA[lVar10].cache);
      }
      GA[lVar10].cache = (double *)0x0;
      pgVar5 = GA;
      pgVar3 = GA + lVar10;
      pgVar3->actv = 0;
      pgVar3->actv_handle = 0;
      if (0 < pgVar5[lVar10].num_rstrctd) {
        pgVar5[lVar10].num_rstrctd = 0;
        if (pgVar5[lVar10].rstrctd_list != (C_Integer *)0x0) {
          free(pgVar5[lVar10].rstrctd_list);
        }
        GA[lVar10].rstrctd_list = (C_Integer *)0x0;
        if (GA[lVar10].rank_rstrctd != (C_Integer *)0x0) {
          free(GA[lVar10].rank_rstrctd);
        }
        GA[lVar10].rank_rstrctd = (C_Integer *)0x0;
      }
      if (GA[lVar10].mapc != (C_Integer *)0x0) {
        free(GA[lVar10].mapc);
        GA[lVar10].mapc = (C_Integer *)0x0;
      }
      if ((GA[lVar10].property == 2) &&
         (pcVar2 = GA[lVar10].cache_head, pcVar2 != (cache_struct_t *)0x0)) {
        __ptr = pcVar2->cache_buf;
        pcVar8 = pcVar2->next;
        while( true ) {
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
          free(GA[lVar10].cache_head);
          if (pcVar8 == (cache_struct *)0x0) break;
          GA[lVar10].cache_head = pcVar8;
          pcVar8 = pcVar8->next;
          __ptr = (GA[lVar10].cache_head)->cache_buf;
        }
      }
      GA[lVar10].cache_head = (cache_struct_t *)0x0;
      if (GA[lVar10].property == 1) {
        free(GA[lVar10].old_mapc);
        pnga_pgroup_destroy((long)GA[lVar10].p_handle);
      }
      pcVar7 = GA[lVar10].ptr[lVar6];
      lVar9 = 1;
      if (pcVar7 != (char *)0x0) {
        if (GA[lVar10].overlay == 0) {
          if (iVar1 < 1) {
            pcVar7 = GA[lVar10].ptr[GAme] + -GA[lVar10].id;
            if (GA[lVar10].mem_dev_set == 0) {
              ARMCI_Free(pcVar7);
            }
            else {
              ARMCI_Free_memdev(pcVar7);
            }
          }
          else {
            ARMCI_Free_group(pcVar7 + -GA[lVar10].id,&PGRP_LIST[grp_id].group);
          }
          if (GA_memory_limited == '\x01') {
            GA_total_memory = GA_total_memory + GA[lVar10].size;
          }
          GAstat.curmem = GAstat.curmem - GA[lVar10].size;
        }
        else {
          GA[lVar10].overlay = 0;
        }
        GA[lVar10].mem_dev_set = 0;
        if (iVar4 != 0) {
          pnga_pgroup_sync(grp_id);
        }
      }
    }
  }
  return lVar9;
}

Assistant:

logical pnga_destroy(Integer g_a)
{
Integer ga_handle = GA_OFFSET + g_a, grp_id, grp_me=GAme;
int local_sync_begin,local_sync_end;

    local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
    _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
    grp_id = (Integer)GA[ga_handle].p_handle;
    if(local_sync_begin)pnga_pgroup_sync(grp_id);

    if (grp_id > 0) grp_me = PGRP_LIST[grp_id].map_proc_list[GAme];
    else grp_me=GAme;
    
    GAstat.numdes ++; /*regardless of array status we count this call */
    /* fails if handle is out of range or array not active */
    if(ga_handle < 0 || ga_handle >= _max_global_array){
       return FALSE;
    }
    if(GA[ga_handle].actv==0){
       return FALSE;
    }
    if (GA[ga_handle].cache)
      free(GA[ga_handle].cache);
    GA[ga_handle].cache = NULL;
    GA[ga_handle].actv = 0;     
    GA[ga_handle].actv_handle = 0;     

    if (GA[ga_handle].num_rstrctd > 0) {
      GA[ga_handle].num_rstrctd = 0;
      if (GA[ga_handle].rstrctd_list)
        free(GA[ga_handle].rstrctd_list);
      GA[ga_handle].rstrctd_list = NULL;

      if (GA[ga_handle].rank_rstrctd)
        free(GA[ga_handle].rank_rstrctd);
      GA[ga_handle].rank_rstrctd = NULL;
    }

    if(GA[ga_handle].mapc != NULL){
       free(GA[ga_handle].mapc);
       GA[ga_handle].mapc = NULL;
    } 

    if (GA[ga_handle].property == READ_CACHE) {
      if (GA[ga_handle].cache_head != NULL) {
        cache_struct_t *next;
        next = GA[ga_handle].cache_head->next;
        if (GA[ga_handle].cache_head->cache_buf)
          free(GA[ga_handle].cache_head->cache_buf);
        free(GA[ga_handle].cache_head);
        while (next) {
          GA[ga_handle].cache_head = next;
          next = next->next;
          if (GA[ga_handle].cache_head->cache_buf)
            free(GA[ga_handle].cache_head->cache_buf);
          free(GA[ga_handle].cache_head);
        }
      }
    }
    GA[ga_handle].cache_head = NULL;

    if (GA[ga_handle].property == READ_ONLY) {
      free(GA[ga_handle].old_mapc);
      pnga_pgroup_destroy(GA[ga_handle].p_handle);
    }

    if(GA[ga_handle].ptr[grp_me]==NULL){
       return TRUE;
    } 
    if (!GA[ga_handle].overlay) {
#ifndef AVOID_MA_STORAGE
      if(gai_uses_shm((int)grp_id)){
#endif
        /* make sure that we free original (before address allignment) pointer */
#ifdef MSG_COMMS_MPI
        if (grp_id > 0){
          ARMCI_Free_group(GA[ga_handle].ptr[grp_me] - GA[ga_handle].id,
              &PGRP_LIST[grp_id].group);
        }
        else
#endif
          if (GA[ga_handle].mem_dev_set) {
            ARMCI_Free_memdev(GA[ga_handle].ptr[GAme]-GA[ga_handle].id);
          } else {
            ARMCI_Free(GA[ga_handle].ptr[GAme] - GA[ga_handle].id);
          }
#ifndef AVOID_MA_STORAGE
      }else{
        if(GA[ga_handle].id != INVALID_MA_HANDLE) MA_free_heap(GA[ga_handle].id);
      }
#endif
      if(GA_memory_limited) GA_total_memory += GA[ga_handle].size;
      GAstat.curmem -= GA[ga_handle].size;
    } else {
      GA[ga_handle].overlay = 0;
    }
    GA[ga_handle].mem_dev_set = 0;     


    if(local_sync_end)pnga_pgroup_sync(grp_id);
    return(TRUE);
}